

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O0

ZZ<45UL> * __thiscall GF2::ZZ<45UL>::operator+=(ZZ<45UL> *this,ZZ<45UL> *zRight)

{
  bool bVar1;
  ulong uVar2;
  word wVar3;
  WW<45UL> *in_RSI;
  WW<45UL> *in_RDI;
  size_t pos;
  word carry;
  ulong local_18;
  
  local_18 = 0;
  bVar1 = false;
  while (!bVar1) {
    uVar2 = local_18 + in_RDI->_words[0];
    in_RDI->_words[0] = uVar2;
    if (uVar2 < local_18) {
      wVar3 = WW<45UL>::GetWord(in_RSI,0);
      in_RDI->_words[0] = wVar3;
    }
    else {
      wVar3 = WW<45UL>::GetWord(in_RSI,0);
      uVar2 = wVar3 + in_RDI->_words[0];
      in_RDI->_words[0] = uVar2;
      wVar3 = WW<45UL>::GetWord(in_RSI,0);
      local_18 = (ulong)(uVar2 < wVar3);
    }
    bVar1 = true;
  }
  WW<45UL>::Trim(in_RDI);
  return (ZZ<45UL> *)in_RDI;
}

Assistant:

ZZ& operator+=(const ZZ& zRight)
	{	
		word carry = 0;
		for (size_t pos = 0; pos < _wcount; ++pos)
			if ((_words[pos] += carry) < carry) 
				_words[pos] = zRight.GetWord(pos);
            else 
				carry = (_words[pos] += zRight.GetWord(pos)) < 
					zRight.GetWord(pos);
		Trim();
		return *this;
	}